

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall kj::Path::Path(Path *this,Array<kj::String> *partsParam)

{
  Array<kj::String> *other;
  size_t extraout_RDX;
  StringPtr part;
  StringPtr local_70;
  String *local_60;
  String *p;
  String *__end1;
  String *__begin1;
  Array<kj::String> *__range1;
  Array<kj::String> local_30;
  Array<kj::String> *local_18;
  Array<kj::String> *partsParam_local;
  Path *this_local;
  
  local_18 = partsParam;
  partsParam_local = &this->parts;
  other = mv<kj::Array<kj::String>>(partsParam);
  Array<kj::String>::Array(&local_30,other);
  Path(this,&local_30,ALREADY_CHECKED);
  Array<kj::String>::~Array(&local_30);
  __begin1 = (String *)this;
  __end1 = Array<kj::String>::begin(&this->parts);
  p = Array<kj::String>::end((Array<kj::String> *)__begin1);
  for (; __end1 != p; __end1 = __end1 + 1) {
    local_60 = __end1;
    StringPtr::StringPtr(&local_70,__end1);
    part.content.size_ = extraout_RDX;
    part.content.ptr = (char *)local_70.content.size_;
    validatePart((Path *)local_70.content.ptr,part);
  }
  return;
}

Assistant:

Path::Path(Array<String> partsParam)
    : Path(kj::mv(partsParam), ALREADY_CHECKED) {
  for (auto& p: parts) {
    validatePart(p);
  }
}